

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O3

void __thiscall gvr::MultiTexturedMesh::~MultiTexturedMesh(MultiTexturedMesh *this)

{
  pointer pcVar1;
  
  (this->super_Mesh).super_PointCloud.super_Model._vptr_Model =
       (_func_int **)&PTR__MultiTexturedMesh_00130ad0;
  if (this->uvt != (UVT *)0x0) {
    operator_delete__(this->uvt);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->name);
  pcVar1 = (this->basepath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->basepath).field_2) {
    operator_delete(pcVar1);
  }
  Mesh::~Mesh(&this->super_Mesh);
  return;
}

Assistant:

MultiTexturedMesh::~MultiTexturedMesh()
{
  delete [] uvt;
}